

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O0

zip_uint16_t get_encryption_method(char *arg)

{
  int iVar1;
  char *arg_local;
  
  iVar1 = strcasecmp(arg,"none");
  if (iVar1 == 0) {
    arg_local._6_2_ = 0;
  }
  else {
    iVar1 = strcasecmp(arg,"PKWARE");
    if (iVar1 == 0) {
      arg_local._6_2_ = 1;
    }
    else {
      iVar1 = strcasecmp(arg,"AES-128");
      if (iVar1 == 0) {
        arg_local._6_2_ = 0x101;
      }
      else {
        iVar1 = strcasecmp(arg,"AES-192");
        if (iVar1 == 0) {
          arg_local._6_2_ = 0x102;
        }
        else {
          iVar1 = strcasecmp(arg,"AES-256");
          if (iVar1 == 0) {
            arg_local._6_2_ = 0x103;
          }
          else {
            iVar1 = strcasecmp(arg,"unknown");
            if (iVar1 == 0) {
              arg_local._6_2_ = 100;
            }
            else {
              arg_local._6_2_ = 0xffff;
            }
          }
        }
      }
    }
  }
  return arg_local._6_2_;
}

Assistant:

static zip_uint16_t
get_encryption_method(const char *arg) {
    if (strcasecmp(arg, "none") == 0)
	return ZIP_EM_NONE;
    else if (strcasecmp(arg, "PKWARE") == 0)
	return ZIP_EM_TRAD_PKWARE;
    else if (strcasecmp(arg, "AES-128") == 0)
	return ZIP_EM_AES_128;
    else if (strcasecmp(arg, "AES-192") == 0)
	return ZIP_EM_AES_192;
    else if (strcasecmp(arg, "AES-256") == 0)
	return ZIP_EM_AES_256;
    else if (strcasecmp(arg, "unknown") == 0)
	return 100;
    return (zip_uint16_t)-1; /* TODO: error handling */
}